

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * fetchPayload(BtCursor *pCur,u32 *pAmt)

{
  uint local_20;
  uint local_1c;
  int amt;
  u32 *pAmt_local;
  BtCursor *pCur_local;
  
  local_1c = (uint)(pCur->info).nLocal;
  if ((int)pCur->pPage->aDataEnd - (int)(pCur->info).pPayload < (int)local_1c) {
    if ((int)pCur->pPage->aDataEnd - (int)(pCur->info).pPayload < 0) {
      local_20 = 0;
    }
    else {
      local_20 = (int)pCur->pPage->aDataEnd - (int)(pCur->info).pPayload;
    }
    local_1c = local_20;
  }
  *pAmt = local_1c;
  return (pCur->info).pPayload;
}

Assistant:

static const void *fetchPayload(
  BtCursor *pCur,      /* Cursor pointing to entry to read from */
  u32 *pAmt            /* Write the number of available bytes here */
){
  int amt;
  assert( pCur!=0 && pCur->iPage>=0 && pCur->pPage);
  assert( pCur->eState==CURSOR_VALID );
  assert( sqlite3_mutex_held(pCur->pBtree->db->mutex) );
  assert( cursorOwnsBtShared(pCur) );
  assert( pCur->ix<pCur->pPage->nCell );
  assert( pCur->info.nSize>0 );
  assert( pCur->info.pPayload>pCur->pPage->aData || CORRUPT_DB );
  assert( pCur->info.pPayload<pCur->pPage->aDataEnd ||CORRUPT_DB);
  amt = pCur->info.nLocal;
  if( amt>(int)(pCur->pPage->aDataEnd - pCur->info.pPayload) ){
    /* There is too little space on the page for the expected amount
    ** of local content. Database must be corrupt. */
    assert( CORRUPT_DB );
    amt = MAX(0, (int)(pCur->pPage->aDataEnd - pCur->info.pPayload));
  }
  *pAmt = (u32)amt;
  return (void*)pCur->info.pPayload;
}